

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O0

void duckdb::RadixScatterArrayVector
               (Vector *v,UnifiedVectorFormat *vdata,idx_t vcount,SelectionVector *sel,
               idx_t add_count,data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,
               idx_t prefix_len,idx_t width,idx_t offset)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  idx_t iVar5;
  ulong *puVar6;
  SelectionVector *in_RCX;
  undefined8 *in_RSI;
  Vector *in_RDI;
  ulong in_R8;
  long in_R9;
  bool bVar7;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  undefined1 unaff_retaddr_01;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  byte in_stack_00000010;
  undefined7 in_stack_00000011;
  byte in_stack_00000018;
  undefined7 in_stack_00000019;
  TemplatedValidityMask<unsigned_long> *in_stack_00000020;
  Vector *in_stack_00000028;
  idx_t array_offset_1;
  data_ptr_t key_location_start_1;
  data_ptr_t *key_location_1;
  idx_t source_idx_1;
  idx_t idx_1;
  idx_t i_1;
  idx_t array_offset;
  data_ptr_t key_location_start;
  data_ptr_t *key_location;
  idx_t source_idx;
  idx_t idx;
  idx_t i;
  data_t invalid;
  data_t valid;
  ValidityMask *validity;
  idx_t array_size;
  Vector *child_vector;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef8;
  ulong local_90;
  ulong local_60;
  
  ArrayVector::GetEntry((Vector *)0x1595e78);
  Vector::GetType(in_RDI);
  ArrayType::GetSize((LogicalType *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if ((in_stack_00000010 & 1) == 0) {
    for (local_90 = 0; local_90 < in_R8; local_90 = local_90 + 1) {
      iVar5 = SelectionVector::get_index(in_RCX,local_90);
      SelectionVector::get_index((SelectionVector *)*in_RSI,iVar5);
      puVar6 = (ulong *)(in_R9 + local_90 * 8);
      uVar1 = *puVar6;
      FlatVector::IncrementalSelectionVector();
      RowOperations::RadixScatter
                (in_stack_00000028,(idx_t)in_stack_00000020,
                 (SelectionVector *)CONCAT71(in_stack_00000019,in_stack_00000018),
                 CONCAT71(in_stack_00000011,in_stack_00000010),
                 (data_ptr_t *)CONCAT71(in_stack_00000009,in_stack_00000008),(bool)unaff_retaddr_01,
                 (bool)unaff_retaddr_00,(bool)unaff_retaddr,array_offset_1,
                 (idx_t)key_location_start_1,(idx_t)key_location_1);
      if ((in_stack_00000008 & 1) != 0) {
        *puVar6 = uVar1;
        while ((undefined1 *)*puVar6 < &in_stack_00000028->vector_type + uVar1) {
          *(byte *)*puVar6 = *(byte *)*puVar6 ^ 0xff;
          *puVar6 = *puVar6 + 1;
        }
      }
    }
  }
  else {
    bVar7 = (in_stack_00000018 & 1) != 0;
    for (local_60 = 0; local_60 < in_R8; local_60 = local_60 + 1) {
      iVar5 = SelectionVector::get_index(in_RCX,local_60);
      SelectionVector::get_index((SelectionVector *)*in_RSI,iVar5);
      puVar6 = (ulong *)(in_R9 + local_60 * 8);
      uVar1 = *puVar6;
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffef8,
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (bVar4) {
        uVar2 = *puVar6;
        *puVar6 = uVar2 + 1;
        *(bool *)uVar2 = bVar7;
        FlatVector::IncrementalSelectionVector();
        in_stack_fffffffffffffef0 = 0;
        in_stack_fffffffffffffef8 = in_stack_00000020;
        RowOperations::RadixScatter
                  (in_stack_00000028,(idx_t)in_stack_00000020,
                   (SelectionVector *)CONCAT71(in_stack_00000019,in_stack_00000018),
                   CONCAT71(in_stack_00000011,in_stack_00000010),
                   (data_ptr_t *)CONCAT71(in_stack_00000009,in_stack_00000008),
                   (bool)unaff_retaddr_01,(bool)unaff_retaddr_00,(bool)unaff_retaddr,array_offset_1,
                   (idx_t)key_location_start_1,(idx_t)key_location_1);
        if ((in_stack_00000008 & 1) != 0) {
          *puVar6 = uVar1 + 1;
          while ((undefined1 *)*puVar6 < &in_stack_00000028->vector_type + uVar1) {
            *(byte *)*puVar6 = *(byte *)*puVar6 ^ 0xff;
            *puVar6 = *puVar6 + 1;
          }
        }
      }
      else {
        pcVar3 = (char *)*puVar6;
        *puVar6 = (ulong)(pcVar3 + 1);
        *pcVar3 = '\x01' - bVar7;
        memset((void *)*puVar6,0,
               (size_t)((long)&in_stack_00000028[-1].auxiliary.internal.
                               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
        *puVar6 = (long)in_stack_00000028 + (*puVar6 - 1);
      }
    }
  }
  return;
}

Assistant:

void RadixScatterArrayVector(Vector &v, UnifiedVectorFormat &vdata, idx_t vcount, const SelectionVector &sel,
                             idx_t add_count, data_ptr_t *key_locations, const bool desc, const bool has_null,
                             const bool nulls_first, const idx_t prefix_len, idx_t width, const idx_t offset) {
	auto &child_vector = ArrayVector::GetEntry(v);
	auto array_size = ArrayType::GetSize(v.GetType());

	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;

			if (validity.RowIsValid(source_idx)) {
				*key_location++ = valid;

				auto array_offset = source_idx * array_size;
				RowOperations::RadixScatter(child_vector, array_size, *FlatVector::IncrementalSelectionVector(), 1,
				                            key_locations + i, false, true, false, prefix_len, width - 1, array_offset);

				// invert bits if desc
				if (desc) {
					// skip over validity byte, handled by nulls first/last
					for (key_location = key_location_start + 1; key_location < key_location_start + width;
					     key_location++) {
						*key_location = ~*key_location;
					}
				}
			} else {
				*key_location++ = invalid;
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;

			auto array_offset = source_idx * array_size;
			RowOperations::RadixScatter(child_vector, array_size, *FlatVector::IncrementalSelectionVector(), 1,
			                            key_locations + i, false, true, false, prefix_len, width, array_offset);
			// invert bits if desc
			if (desc) {
				for (key_location = key_location_start; key_location < key_location_start + width; key_location++) {
					*key_location = ~*key_location;
				}
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	}
}